

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O3

char * __thiscall cmSourceFile::GetProperty(cmSourceFile *this,string *prop)

{
  size_t __n;
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  cmState *this_01;
  
  __n = prop->_M_string_length;
  if (__n == propLOCATION_abi_cxx11_._M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((prop->_M_dataplus)._M_p,propLOCATION_abi_cxx11_._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_001e30a3;
    }
    pcVar3 = (char *)(this->FullPath)._M_string_length;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (this->FullPath)._M_dataplus._M_p;
    }
  }
  else {
LAB_001e30a3:
    pcVar3 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
    if (pcVar3 == (char *)0x0) {
      this_00 = (this->Location).Makefile;
      this_01 = cmMakefile::GetState(this_00);
      bVar1 = cmState::IsPropertyChained(this_01,prop,SOURCE_FILE);
      if (bVar1) {
        pcVar3 = cmMakefile::GetProperty(this_00,prop,true);
        return pcVar3;
      }
      pcVar3 = (char *)0x0;
    }
  }
  return pcVar3;
}

Assistant:

const char* cmSourceFile::GetProperty(const std::string& prop) const
{
  // Check for computed properties.
  if (prop == propLOCATION) {
    if (this->FullPath.empty()) {
      return nullptr;
    }
    return this->FullPath.c_str();
  }

  const char* retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal) {
    cmMakefile const* mf = this->Location.GetMakefile();
    const bool chain =
      mf->GetState()->IsPropertyChained(prop, cmProperty::SOURCE_FILE);
    if (chain) {
      return mf->GetProperty(prop, chain);
    }
  }

  return retVal;
}